

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lambda.cpp
# Opt level: O0

void __thiscall lambda_apply_Test::TestBody(lambda_apply_Test *this)

{
  bool bVar1;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  tuple<int,_int,_int> args;
  tuple<int,_int,_int> *in_stack_ffffffffffffff88;
  AssertHelper *this_00;
  int *in_stack_ffffffffffffff98;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_30;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  AssertHelper local_14 [2];
  
  local_18 = 2;
  local_1c = 4;
  local_20 = 5;
  this_00 = local_14;
  std::make_tuple<int,int,int>
            (in_stack_ffffffffffffff98,(int *)this_00,(int *)in_stack_ffffffffffffff88);
  lambda::apply<int(&)(int,int,int),std::tuple<int,int,int>&>
            ((_func_int_int_int_int *)this_00,in_stack_ffffffffffffff88);
  this_01 = &local_30;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(int *)this_01,
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1916cb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,(char *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x191717);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x191767);
  return;
}

Assistant:

TEST(lambda, apply) {
    auto args = std::make_tuple(2, 4, 5);
    ASSERT_EQ(lmd::apply(mul, args), 40);
}